

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O3

void __thiscall QDesktopUnixServices::~QDesktopUnixServices(QDesktopUnixServices *this)

{
  QObject *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  
  (this->super_QPlatformServices)._vptr_QPlatformServices =
       (_func_int **)&PTR__QDesktopUnixServices_007e2cb8;
  pDVar3 = (this->m_watcher).wp.d;
  if (pDVar3 != (Data *)0x0) {
    if (((pDVar3->strongref)._q_value.super___atomic_base<int>._M_i != 0) &&
       (pQVar1 = (this->m_watcher).wp.value, pQVar1 != (QObject *)0x0)) {
      (**(code **)(*(long *)pQVar1 + 0x20))();
      pDVar3 = (this->m_watcher).wp.d;
      if (pDVar3 == (Data *)0x0) goto LAB_00621407;
    }
    LOCK();
    (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar3->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar3 = (this->m_watcher).wp.d;
      if (pDVar3 == (Data *)0x0) {
        pDVar3 = (Data *)0x0;
      }
      operator_delete(pDVar3);
    }
  }
LAB_00621407:
  pDVar2 = (this->m_documentLauncher).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_documentLauncher).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar2 = (this->m_webBrowser).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_webBrowser).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QDesktopUnixServices::~QDesktopUnixServices()
{
#if QT_CONFIG(dbus)
    delete m_watcher;
#endif
}